

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O2

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
          (DelayedDestructor<helics::Broker> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  __first;
  iterator __end0;
  pointer psVar3;
  iterator __begin0;
  pointer psVar4;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *this_00;
  pointer psVar5;
  shared_ptr<helics::Broker> *element_1;
  unique_lock<std::timed_mutex> lock;
  vector<void_*,_std::allocator<void_*>_> epointers;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> ecall;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range4;
  milliseconds wait;
  function<void_(std::shared_ptr<helics::Broker>_&)> deleteFunc;
  
  wait.__r = 200;
  lock._M_owns = false;
  lock._M_device = &this->destructionLock;
  bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>(&lock,&wait);
  if (bVar2) {
    psVar4 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = psVar3;
    if (psVar3 != psVar4) {
      this_00 = &ecall;
      ecall.
      super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ecall.
      super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ecall.
      super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      epointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      epointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      epointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (; psVar4 != psVar3; psVar4 = psVar4 + 1) {
        p_Var1 = (psVar4->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var1->_M_use_count == 1)) {
          std::
          vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
          ::push_back(this_00,psVar4);
          deleteFunc.super__Function_base._M_functor._M_unused._M_object =
               (psVar4->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::vector<void*,std::allocator<void*>>::emplace_back<helics::Broker*>
                    ((vector<void*,std::allocator<void*>> *)&epointers,(Broker **)&deleteFunc);
        }
      }
      if (epointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          epointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar2 = true;
      }
      else {
        __first = std::
                  __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<helics::Broker>*,std::vector<std::shared_ptr<helics::Broker>,std::allocator<std::shared_ptr<helics::Broker>>>>,__gnu_cxx::__ops::_Iter_pred<gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects()::_lambda(auto:1_const&)_1_>>
                            ((this->ElementsToBeDestroyed).
                             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->ElementsToBeDestroyed).
                             super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_concurrency_gmlc_concurrency_DelayedDestructor_hpp:106:40)>
                              )&epointers);
        std::
        vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
        erase(&this->ElementsToBeDestroyed,(const_iterator)__first._M_current,
              (this->ElementsToBeDestroyed).
              super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                   *)((long)(this->ElementsToBeDestroyed).
                            super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->ElementsToBeDestroyed).
                            super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::function<void_(std::shared_ptr<helics::Broker>_&)>::function
                  (&deleteFunc,&this->callBeforeDeleteFunction);
        std::unique_lock<std::timed_mutex>::unlock(&lock);
        psVar4 = ecall.
                 super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (deleteFunc.super__Function_base._M_manager != (_Manager_type)0x0) {
          for (psVar3 = ecall.
                        super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar4;
              psVar3 = psVar3 + 1) {
            std::function<void_(std::shared_ptr<helics::Broker>_&)>::operator()(&deleteFunc,psVar3);
          }
        }
        std::
        vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
        clear(&ecall);
        bVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                          (&lock,&wait);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&deleteFunc);
      }
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&epointers.super__Vector_base<void_*,_std::allocator<void_*>_>);
      std::
      vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
      ~vector(&ecall);
      if (bVar2 == false) goto LAB_0024537c;
      psVar3 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    this_00 = (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               *)((long)psVar5 - (long)psVar3 >> 4);
  }
  else {
    this_00 = (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               *)0xffffffffffffffff;
  }
LAB_0024537c:
  std::unique_lock<std::timed_mutex>::~unique_lock(&lock);
  return (size_t)this_00;
}

Assistant:

size_t destroyObjects() noexcept
    {
        std::size_t elementSize{static_cast<std::size_t>(-1)};
        std::chrono::milliseconds wait(std::chrono::milliseconds(200));
        try {
            std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                    std::defer_lock);
            if (!lock.try_lock_for(wait)) {
                return elementSize;
            }
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                std::vector<std::shared_ptr<X>> ecall;
                std::vector<void*> epointers;
                for (auto& element : ElementsToBeDestroyed) {
                    if (element.use_count() == 1) {
                        ecall.push_back(element);
                        epointers.emplace_back(element.get());
                    }
                }
                if (!epointers.empty()) {
                    // so apparently remove_if can actually call the
                    // destructor for shared_ptrs so the call function needs
                    // to be before this call
                    auto loc =
                        std::remove_if(ElementsToBeDestroyed.begin(),
                                       ElementsToBeDestroyed.end(),
                                       [&epointers](const auto& element) {
                                           return (
                                               (element.use_count() == 2) &&
                                               (std::find(epointers.begin(),
                                                          epointers.end(),
                                                          static_cast<void*>(
                                                              element.get())) !=
                                                epointers.end()));
                                       });
                    ElementsToBeDestroyed.erase(loc,
                                                ElementsToBeDestroyed.end());
                    elementSize = ElementsToBeDestroyed.size();
                    auto deleteFunc = callBeforeDeleteFunction;
                    lock.unlock();
                    // this needs to be done after the lock, so a destructor
                    // can never called while under the lock
                    if (deleteFunc) {
                        for (auto& element : ecall) {
                            deleteFunc(element);
                        }
                    }
                    ecall.clear();  // make sure the destructors get called
                                    // before returning.
                    // reengage the lock so the size is correct
                    if (!lock.try_lock_for(wait)) {
                        return elementSize;
                    }
                }
            }
            return ElementsToBeDestroyed.size();
        }
        catch (...) {
        }
        return elementSize;
    }